

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression * new_ir_constbool(Context_conflict *ctx,int val)

{
  MOJOSHADER_irConstant *retval;
  int val_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x60);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 1;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    *(undefined4 *)&ctx_local->malloc_data = 1;
    *(undefined4 *)((long)&ctx_local->malloc_data + 4) = 1;
    *(int *)&ctx_local->errors = val;
  }
  return (MOJOSHADER_irExpression *)ctx_local;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_constbool(Context *ctx, const int val)
{
    // !!! FIXME: cache true and false in (ctx), ignore in delete_ir().
    NEW_IR_EXPR(retval, MOJOSHADER_irConstant, MOJOSHADER_IR_CONSTANT, MOJOSHADER_AST_DATATYPE_BOOL, 1);
    retval->value.ival[0] = val;
    return (MOJOSHADER_irExpression *) retval;
}